

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.hpp
# Opt level: O1

int32_t __thiscall
poincare_disc::
Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getLine(Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ifstream *ifs,vector<int,_std::allocator<int>_> *words)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  size_t *psVar4;
  int iVar5;
  iterator __position;
  string token;
  int local_54;
  key_type local_50;
  
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar5 = 0;
  while( true ) {
    bVar2 = readWord(this,ifs,&local_50);
    if (!bVar2) break;
    if (local_50._M_string_length == DAT_00112250) {
      if (local_50._M_string_length == 0) break;
      iVar3 = bcmp(local_50._M_dataplus._M_p,EOS_abi_cxx11_,local_50._M_string_length);
      if (iVar3 == 0) break;
    }
    psVar4 = get_hash(this,&local_50);
    if (psVar4 == (size_t *)0x0) {
      psVar4 = get_hash(this,(key_type *)UNK_abi_cxx11_);
      local_54 = (int)*psVar4;
      __position._M_current =
           (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current !=
          (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_0010bfda;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(words,__position,&local_54);
    }
    else {
      local_54 = (int)*psVar4;
      __position._M_current =
           (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(words,__position,&local_54);
      }
      else {
LAB_0010bfda:
        *__position._M_current = local_54;
        (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    iVar5 = iVar5 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

const int32_t getLine(std::ifstream& ifs, std::vector<int32_t>& words) {
        std::uniform_real_distribution<> uniform(0, 1);

        words.clear();
        int32_t ntokens = 0;
        std::string token;
        while (this->readWord(ifs, token) && token != EOS) {
            size_t* wid = get_hash(token);
            ntokens++;
            if(wid) {
                words.push_back(*wid);       
            } else {
                wid = get_hash(UNK);
                words.push_back(*wid);       
            }
        }
        return ntokens;
    }